

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::TriangleFanCase::generateTriangles
          (TriangleFanCase *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *outTriangles)

{
  undefined8 uVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  size_type sVar7;
  MessageBuilder local_438;
  int local_2b4;
  size_type sStack_2b0;
  int vtxNdx;
  MessageBuilder local_298;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  *local_28;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  *outTriangles_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData_local;
  TriangleFanCase *pTStack_10;
  int iteration_local;
  TriangleFanCase *this_local;
  
  local_28 = outTriangles;
  outTriangles_local =
       (vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        *)outData;
  outData_local._4_4_ = iteration;
  pTStack_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,5);
  if (outData_local._4_4_ == 0) {
    tcu::Vector<float,_4>::Vector(&local_38,0.01,0.0,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,0);
    *(undefined8 *)pvVar3->m_data = local_38.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_38.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_48,0.5,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,1);
    *(undefined8 *)pvVar3->m_data = local_48.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_48.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_58,0.46,0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,2);
    *(undefined8 *)pvVar3->m_data = local_58.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_58.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_68,-0.5,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,3);
    *(undefined8 *)pvVar3->m_data = local_68.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_68.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_78,-1.5,-0.4,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,4);
    *(undefined8 *)pvVar3->m_data = local_78.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_78.m_data._8_8_;
  }
  else if (outData_local._4_4_ == 1) {
    tcu::Vector<float,_4>::Vector(&local_88,-0.499,0.128,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,0);
    *(undefined8 *)pvVar3->m_data = local_88.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_88.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_98,-0.501,-0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,1);
    *(undefined8 *)pvVar3->m_data = local_98.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_98.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_a8,0.11,-0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,2);
    *(undefined8 *)pvVar3->m_data = local_a8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_a8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_b8,0.11,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,3);
    *(undefined8 *)pvVar3->m_data = local_b8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_b8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_c8,0.88,0.9,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,4);
    *(undefined8 *)pvVar3->m_data = local_c8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_c8.m_data._8_8_;
  }
  else if (outData_local._4_4_ == 2) {
    tcu::Vector<float,_4>::Vector(&local_d8,-0.9,-0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,0);
    *(undefined8 *)pvVar3->m_data = local_d8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_d8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_e8,1.1,-0.9,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,1);
    *(undefined8 *)pvVar3->m_data = local_e8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_e8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_f8,0.7,-0.1,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,2);
    *(undefined8 *)pvVar3->m_data = local_f8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_f8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_108,0.11,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,3);
    *(undefined8 *)pvVar3->m_data = local_108.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_108.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_118,0.88,0.7,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,4);
    *(undefined8 *)pvVar3->m_data = local_118.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_118.m_data._8_8_;
  }
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(local_28,3);
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,0);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[0].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[0].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  pvVar4->sharedEdge[0] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,1);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[1].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[1].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  pvVar4->sharedEdge[1] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,2);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[2].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[2].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  pvVar4->sharedEdge[2] = true;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,0);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[0].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[0].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  pvVar4->sharedEdge[0] = true;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,2);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[1].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[1].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  pvVar4->sharedEdge[1] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,3);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[2].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[2].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  pvVar4->sharedEdge[2] = true;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,0);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,2);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[0].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[0].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,2);
  pvVar4->sharedEdge[0] = true;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,3);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,2);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[1].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[1].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,2);
  pvVar4->sharedEdge[1] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,4);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,2);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[2].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[2].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,2);
  pvVar4->sharedEdge[2] = false;
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_BaseTriangleCase).super_BaseRenderingCase.super_TestCase.
                      super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_298,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_298,(char (*) [25])"Rendering triangle fan, ");
  sStack_2b0 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                         ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          outTriangles_local);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xfffffffffffffd50);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])0x2be5890);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_298);
  for (local_2b4 = 0; iVar2 = local_2b4,
      sVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         outTriangles_local), iVar2 < (int)sVar7; local_2b4 = local_2b4 + 1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_BaseTriangleCase).super_BaseRenderingCase.super_TestCase.
                        super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_438,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_438,(char (*) [2])0x2b88b2a);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,(long)local_2b4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,pvVar3);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_438);
  }
  return;
}

Assistant:

void TriangleFanCase::generateTriangles (int iteration, std::vector<tcu::Vec4>& outData, std::vector<TriangleSceneSpec::SceneTriangle>& outTriangles)
{
	outData.resize(5);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.01f,  0.0f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,   0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.46f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(-1.5f,  -0.4f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  1.1f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.7f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4( 0.11f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f, 0.0f, 1.0f);
			break;
	}

	outTriangles.resize(3);
	outTriangles[0].positions[0] = outData[0];	outTriangles[0].sharedEdge[0] = false;
	outTriangles[0].positions[1] = outData[1];	outTriangles[0].sharedEdge[1] = false;
	outTriangles[0].positions[2] = outData[2];	outTriangles[0].sharedEdge[2] = true;

	outTriangles[1].positions[0] = outData[0];	outTriangles[1].sharedEdge[0] = true;
	outTriangles[1].positions[1] = outData[2];	outTriangles[1].sharedEdge[1] = false;
	outTriangles[1].positions[2] = outData[3];	outTriangles[1].sharedEdge[2] = true;

	outTriangles[2].positions[0] = outData[0];	outTriangles[2].sharedEdge[0] = true;
	outTriangles[2].positions[1] = outData[3];	outTriangles[2].sharedEdge[1] = false;
	outTriangles[2].positions[2] = outData[4];	outTriangles[2].sharedEdge[2] = false;

	// log
	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering triangle fan, " << outData.size() << " vertices." << tcu::TestLog::EndMessage;
	for (int vtxNdx = 0; vtxNdx < (int)outData.size(); ++vtxNdx)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "\t" << outData[vtxNdx]
			<< tcu::TestLog::EndMessage;
	}
}